

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O1

void __thiscall Transform::Transform(Transform *this,Matrix4f *m,Object3D *obj)

{
  (this->super_Object3D).type._M_dataplus._M_p = (pointer)&(this->super_Object3D).type.field_2;
  (this->super_Object3D).type._M_string_length = 0;
  (this->super_Object3D).type.field_2._M_local_buf[0] = '\0';
  (this->super_Object3D).material = (Material *)0x0;
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Object3D_0013fb70;
  this->_object = obj;
  Matrix4f::Matrix4f(&this->_m,m);
  Matrix4f::inverse(&this->_m_inverse,m,(bool *)0x0,0.0);
  return;
}

Assistant:

Transform(const Matrix4f &m, Object3D *obj) : _object(obj), _m(m), _m_inverse(m.inverse()) {}